

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O0

void __thiscall
FIX::UnsupportedMessageType::UnsupportedMessageType(UnsupportedMessageType *this,string *what)

{
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *what_local;
  UnsupportedMessageType *this_local;
  
  local_18 = what;
  what_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Unsupported Message Type",&local_39);
  Exception::Exception(&this->super_Exception,&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  *(undefined ***)&this->super_Exception = &PTR__UnsupportedMessageType_0017ca88;
  return;
}

Assistant:

UnsupportedMessageType(const std::string &what = "")
      : Exception("Unsupported Message Type", what) {}